

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipField(ParserImpl *this)

{
  string *__lhs;
  bool bVar1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string field_name;
  
  std::__cxx11::string::string((string *)local_48,"[",(allocator *)&local_68);
  bVar1 = TryConsume(this,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  if (bVar1) {
    bVar1 = ConsumeTypeUrlOrFullTypeName(this);
    if (!bVar1) {
      return false;
    }
    std::__cxx11::string::string((string *)local_48,"]",(allocator *)&local_68);
    bVar1 = Consume(this,(string *)local_48);
  }
  else {
    local_48 = (undefined1  [8])&field_name._M_string_length;
    field_name._M_dataplus._M_p = (pointer)0x0;
    field_name._M_string_length._0_1_ = 0;
    bVar1 = ConsumeIdentifier(this,(string *)local_48);
  }
  std::__cxx11::string::~string((string *)local_48);
  if (bVar1 == false) {
    return false;
  }
  std::__cxx11::string::string
            ((string *)local_48,":",(allocator *)(field_name.field_2._M_local_buf + 0xf));
  bVar1 = TryConsume(this,(string *)local_48);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&local_68,"{",(allocator *)(field_name.field_2._M_local_buf + 0xd));
    __lhs = &(this->tokenizer_).current_.text;
    _Var2 = std::operator==(__lhs,&local_68);
    if (_Var2) {
      std::__cxx11::string::~string((string *)&local_68);
      goto LAB_0031762f;
    }
    std::__cxx11::string::string
              ((string *)&local_88,"<",(allocator *)(field_name.field_2._M_local_buf + 0xe));
    _Var2 = std::operator==(__lhs,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)local_48);
    if (!_Var2) {
      bVar1 = SkipFieldValue(this);
      goto LAB_00317640;
    }
  }
  else {
LAB_0031762f:
    std::__cxx11::string::~string((string *)local_48);
  }
  bVar1 = SkipFieldMessage(this);
LAB_00317640:
  if (bVar1 == false) {
    return false;
  }
  std::__cxx11::string::string((string *)local_48,";",(allocator *)&local_88);
  bVar1 = TryConsume(this,(string *)local_48);
  if (!bVar1) {
    std::__cxx11::string::string
              ((string *)&local_68,",",(allocator *)(field_name.field_2._M_local_buf + 0xf));
    TryConsume(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::~string((string *)local_48);
  return true;
}

Assistant:

bool SkipField() {
    if (TryConsume("[")) {
      // Extension name or type URL.
      DO(ConsumeTypeUrlOrFullTypeName());
      DO(Consume("]"));
    } else {
      std::string field_name;
      DO(ConsumeIdentifier(&field_name));
    }

    // Try to guess the type of this field.
    // If this field is not a message, there should be a ":" between the
    // field name and the field value and also the field value should not
    // start with "{" or "<" which indicates the beginning of a message body.
    // If there is no ":" or there is a "{" or "<" after ":", this field has
    // to be a message or the input is ill-formed.
    if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
      DO(SkipFieldValue());
    } else {
      DO(SkipFieldMessage());
    }
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");
    return true;
  }